

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.cpp
# Opt level: O2

void __thiscall embree::GridMesh::commit(GridMesh *this)

{
  size_t sVar1;
  undefined8 *puVar2;
  size_t *psVar3;
  ulong uVar4;
  size_t *psVar5;
  allocator local_39;
  string local_38 [32];
  
  psVar3 = &(((this->vertices).items)->super_RawBufferView).stride;
  uVar4 = 0xffffffffffffffff;
  psVar5 = psVar3;
  do {
    uVar4 = uVar4 + 1;
    if ((this->super_Geometry).numTimeSteps <= uVar4) {
      Geometry::commit(&this->super_Geometry);
      return;
    }
    sVar1 = *psVar5;
    psVar5 = psVar5 + 7;
  } while ((int)sVar1 == (int)*psVar3);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            (local_38,"stride of vertex buffers have to be identical for each time step",&local_39);
  *puVar2 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar2 + 1) = 3;
  std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
  __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

void GridMesh::commit()
  {
    /* verify that stride of all time steps are identical */
    for (unsigned int t=0; t<numTimeSteps; t++) {
      if (vertices[t].getStride() != vertices[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"stride of vertex buffers have to be identical for each time step");
      if (vertices[t]) vertices[t].buffer->commitIfNeeded();
    }
    if (grids) grids.buffer->commitIfNeeded();
#if defined(EMBREE_SYCL_SUPPORT)
    
    /* build quadID_to_primID_xy mapping when hardware ray tracing is supported */
    DeviceGPU* gpu_device = dynamic_cast<DeviceGPU*>(device);
    if (gpu_device)
    {
      const size_t numQuads = getNumTotalQuads();
      quadID_to_primID_xy.resize(numQuads);
      
      for (uint32_t primID=0, quadID=0; primID<size(); primID++)
      {
        const Grid& g = grid(primID);
        for (ssize_t y=0; y<ssize_t(g.resY)-1; y++)
          for (ssize_t x=0; x<ssize_t(g.resX)-1; x++)
            quadID_to_primID_xy[quadID++] = { primID, (uint16_t) x, (uint16_t) y };
      }
    }

#endif
    
    Geometry::commit();
  }